

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O0

FT_Error tt_face_get_name(TT_Face face,FT_UShort nameid,FT_String **name)

{
  FT_Stream stream_00;
  FT_Byte *pFVar1;
  bool bVar2;
  FT_Stream stream;
  TT_Name_ConvertFunc convert;
  uint uStack_58;
  FT_Bool is_english;
  FT_Int found_unicode;
  FT_Int found_win;
  FT_Int found_apple_english;
  FT_Int found_apple_roman;
  FT_Int found_apple;
  TT_Name rec;
  void *pvStack_38;
  FT_UShort n;
  FT_String *result;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory;
  FT_String **name_local;
  TT_Face pTStack_10;
  FT_UShort nameid_local;
  TT_Face face_local;
  
  pFStack_28 = (face->root).memory;
  result._4_4_ = 0;
  pvStack_38 = (void *)0x0;
  found_win = -1;
  found_unicode = -1;
  uStack_58 = 0xffffffff;
  convert._4_4_ = 0xffffffff;
  bVar2 = false;
  _found_apple_roman = (face->name_table).names;
  for (rec._6_2_ = 0; rec._6_2_ < face->num_names; rec._6_2_ = rec._6_2_ + 1) {
    if ((_found_apple_roman->nameID == nameid) && (_found_apple_roman->stringLength != 0)) {
      switch(_found_apple_roman->platformID) {
      case 0:
      case 2:
        convert._4_4_ = (uint)rec._6_2_;
        break;
      case 1:
        if (_found_apple_roman->languageID == 0) {
          found_unicode = (FT_Int)rec._6_2_;
        }
        else if (_found_apple_roman->encodingID == 0) {
          found_win = (FT_Int)rec._6_2_;
        }
        break;
      case 3:
        if (((uStack_58 == 0xffffffff) || ((_found_apple_roman->languageID & 0x3ff) == 9)) &&
           ((_found_apple_roman->encodingID < 2 || (_found_apple_roman->encodingID == 10)))) {
          bVar2 = (_found_apple_roman->languageID & 0x3ff) == 9;
          uStack_58 = (uint)rec._6_2_;
        }
      }
    }
    _found_apple_roman = _found_apple_roman + 1;
  }
  found_apple_english = found_win;
  if (-1 < found_unicode) {
    found_apple_english = found_unicode;
  }
  stream = (FT_Stream)0x0;
  if (((int)uStack_58 < 0) || ((-1 < found_apple_english && (!bVar2)))) {
    if (found_apple_english < 0) {
      if (-1 < (int)convert._4_4_) {
        _found_apple_roman = (face->name_table).names + (int)convert._4_4_;
        stream = (FT_Stream)tt_name_ascii_from_utf16;
      }
    }
    else {
      _found_apple_roman = (face->name_table).names + found_apple_english;
      stream = (FT_Stream)tt_name_ascii_from_other;
    }
  }
  else {
    _found_apple_roman = (face->name_table).names + (int)uStack_58;
    if (_found_apple_roman->encodingID < 2) {
      stream = (FT_Stream)tt_name_ascii_from_utf16;
    }
    else if (_found_apple_roman->encodingID == 10) {
      stream = (FT_Stream)tt_name_ascii_from_utf16;
    }
  }
  memory = (FT_Memory)name;
  if ((_found_apple_roman != (TT_NameRec *)0x0) && (stream != (FT_Stream)0x0)) {
    name_local._6_2_ = nameid;
    pTStack_10 = face;
    if (_found_apple_roman->string == (FT_Byte *)0x0) {
      stream_00 = (face->name_table).stream;
      pFVar1 = (FT_Byte *)
               ft_mem_qrealloc(pFStack_28,1,0,(ulong)_found_apple_roman->stringLength,(void *)0x0,
                               (FT_Error *)((long)&result + 4));
      _found_apple_roman->string = pFVar1;
      if (((result._4_4_ != 0) ||
          (result._4_4_ = FT_Stream_Seek(stream_00,_found_apple_roman->stringOffset),
          result._4_4_ != 0)) ||
         (result._4_4_ = FT_Stream_Read(stream_00,_found_apple_roman->string,
                                        (ulong)_found_apple_roman->stringLength), result._4_4_ != 0)
         ) {
        ft_mem_free(pFStack_28,_found_apple_roman->string);
        _found_apple_roman->string = (FT_Byte *)0x0;
        _found_apple_roman->stringLength = 0;
        pvStack_38 = (void *)0x0;
        goto LAB_00331c7b;
      }
    }
    pvStack_38 = (void *)(*(code *)stream)(_found_apple_roman,pFStack_28);
  }
LAB_00331c7b:
  memory->user = pvStack_38;
  return result._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_get_name( TT_Face      face,
                    FT_UShort    nameid,
                    FT_String**  name )
  {
    FT_Memory   memory = face->root.memory;
    FT_Error    error  = FT_Err_Ok;
    FT_String*  result = NULL;
    FT_UShort   n;
    TT_Name     rec;

    FT_Int  found_apple         = -1;
    FT_Int  found_apple_roman   = -1;
    FT_Int  found_apple_english = -1;
    FT_Int  found_win           = -1;
    FT_Int  found_unicode       = -1;

    FT_Bool  is_english = 0;

    TT_Name_ConvertFunc  convert;


    FT_ASSERT( name );

    rec = face->name_table.names;
    for ( n = 0; n < face->num_names; n++, rec++ )
    {
      /* According to the OpenType 1.3 specification, only Microsoft or  */
      /* Apple platform IDs might be used in the `name' table.  The      */
      /* `Unicode' platform is reserved for the `cmap' table, and the    */
      /* `ISO' one is deprecated.                                        */
      /*                                                                 */
      /* However, the Apple TrueType specification doesn't say the same  */
      /* thing and goes to suggest that all Unicode `name' table entries */
      /* should be coded in UTF-16 (in big-endian format I suppose).     */
      /*                                                                 */
      if ( rec->nameID == nameid && rec->stringLength > 0 )
      {
        switch ( rec->platformID )
        {
        case TT_PLATFORM_APPLE_UNICODE:
        case TT_PLATFORM_ISO:
          /* there is `languageID' to check there.  We should use this */
          /* field only as a last solution when nothing else is        */
          /* available.                                                */
          /*                                                           */
          found_unicode = n;
          break;

        case TT_PLATFORM_MACINTOSH:
          /* This is a bit special because some fonts will use either    */
          /* an English language id, or a Roman encoding id, to indicate */
          /* the English version of its font name.                       */
          /*                                                             */
          if ( rec->languageID == TT_MAC_LANGID_ENGLISH )
            found_apple_english = n;
          else if ( rec->encodingID == TT_MAC_ID_ROMAN )
            found_apple_roman = n;
          break;

        case TT_PLATFORM_MICROSOFT:
          /* we only take a non-English name when there is nothing */
          /* else available in the font                            */
          /*                                                       */
          if ( found_win == -1 || ( rec->languageID & 0x3FF ) == 0x009 )
          {
            switch ( rec->encodingID )
            {
            case TT_MS_ID_SYMBOL_CS:
            case TT_MS_ID_UNICODE_CS:
            case TT_MS_ID_UCS_4:
              is_english = FT_BOOL( ( rec->languageID & 0x3FF ) == 0x009 );
              found_win  = n;
              break;

            default:
              ;
            }
          }
          break;

        default:
          ;
        }
      }
    }

    found_apple = found_apple_roman;
    if ( found_apple_english >= 0 )
      found_apple = found_apple_english;

    /* some fonts contain invalid Unicode or Macintosh formatted entries; */
    /* we will thus favor names encoded in Windows formats if available   */
    /* (provided it is an English name)                                   */
    /*                                                                    */
    convert = NULL;
    if ( found_win >= 0 && !( found_apple >= 0 && !is_english ) )
    {
      rec = face->name_table.names + found_win;
      switch ( rec->encodingID )
      {
        /* all Unicode strings are encoded using UTF-16BE */
      case TT_MS_ID_UNICODE_CS:
      case TT_MS_ID_SYMBOL_CS:
        convert = tt_name_ascii_from_utf16;
        break;

      case TT_MS_ID_UCS_4:
        /* Apparently, if this value is found in a name table entry, it is */
        /* documented as `full Unicode repertoire'.  Experience with the   */
        /* MsGothic font shipped with Windows Vista shows that this really */
        /* means UTF-16 encoded names (UCS-4 values are only used within   */
        /* charmaps).                                                      */
        convert = tt_name_ascii_from_utf16;
        break;

      default:
        ;
      }
    }
    else if ( found_apple >= 0 )
    {
      rec     = face->name_table.names + found_apple;
      convert = tt_name_ascii_from_other;
    }
    else if ( found_unicode >= 0 )
    {
      rec     = face->name_table.names + found_unicode;
      convert = tt_name_ascii_from_utf16;
    }

    if ( rec && convert )
    {
      if ( !rec->string )
      {
        FT_Stream  stream = face->name_table.stream;


        if ( FT_QNEW_ARRAY ( rec->string, rec->stringLength ) ||
             FT_STREAM_SEEK( rec->stringOffset )              ||
             FT_STREAM_READ( rec->string, rec->stringLength ) )
        {
          FT_FREE( rec->string );
          rec->stringLength = 0;
          result            = NULL;
          goto Exit;
        }
      }

      result = convert( rec, memory );
    }

  Exit:
    *name = result;
    return error;
  }